

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswMan.c
# Opt level: O3

void Ssw_ManStop(Ssw_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *__ptr;
  
  if (p->pVisited != (int *)0x0) {
    free(p->pVisited);
    p->pVisited = (int *)0x0;
  }
  if (p->pPars->fVerbose != 0) {
    Ssw_ManPrintStats(p);
  }
  if (p->ppClasses != (Ssw_Cla_t *)0x0) {
    Ssw_ClassesStop(p->ppClasses);
  }
  if (p->pSml != (Ssw_Sml_t *)0x0) {
    Ssw_SmlStop(p->pSml);
  }
  pVVar1 = p->vDiffPairs;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar1 = p->vInits;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
    }
    free(pVVar1);
  }
  pVVar2 = p->vResimConsts;
  ppvVar3 = pVVar2->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar2);
  pVVar2 = p->vResimClasses;
  ppvVar3 = pVVar2->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar2);
  pVVar2 = p->vNewLos;
  ppvVar3 = pVVar2->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar2);
  pVVar1 = p->vNewPos;
  __ptr = pVVar1->pArray;
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(pVVar1);
  pVVar2 = p->vCommon;
  ppvVar3 = pVVar2->pArray;
  if (ppvVar3 != (void **)0x0) {
    free(ppvVar3);
  }
  free(pVVar2);
  if (p->pNodeToFrames != (Aig_Obj_t **)0x0) {
    free(p->pNodeToFrames);
    p->pNodeToFrames = (Aig_Obj_t **)0x0;
  }
  if (p->pPatWords != (uint *)0x0) {
    free(p->pPatWords);
  }
  free(p);
  return;
}

Assistant:

void Ssw_ManStop( Ssw_Man_t * p )
{
    ABC_FREE( p->pVisited );
    if ( p->pPars->fVerbose )//&& p->pPars->nStepsMax == -1 )
        Ssw_ManPrintStats( p );
    if ( p->ppClasses )
        Ssw_ClassesStop( p->ppClasses );
    if ( p->pSml )
        Ssw_SmlStop( p->pSml );
    if ( p->vDiffPairs )
        Vec_IntFree( p->vDiffPairs );
    if ( p->vInits )
        Vec_IntFree( p->vInits );
    Vec_PtrFree( p->vResimConsts );
    Vec_PtrFree( p->vResimClasses );
    Vec_PtrFree( p->vNewLos );
    Vec_IntFree( p->vNewPos );
    Vec_PtrFree( p->vCommon );
    ABC_FREE( p->pNodeToFrames );
    ABC_FREE( p->pPatWords );
    ABC_FREE( p );
}